

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall FValueTextItem::Drawer(FValueTextItem *this,bool selected)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  FString *this_00;
  EColorRange local_4c;
  char *local_30;
  char *mOptValue;
  char *pcStack_20;
  int x;
  char *text;
  bool selected_local;
  FValueTextItem *this_local;
  
  pcStack_20 = FString::operator_cast_to_char_(&this->mText);
  if (*pcStack_20 == '$') {
    pcStack_20 = FStringTable::operator()(&GStrings,pcStack_20 + 1);
  }
  if (selected) {
    local_4c = OptionSettings.mFontColorSelection;
  }
  else {
    local_4c = this->mFontColor;
  }
  DCanvas::DrawText((DCanvas *)screen,this->mFont,local_4c,
                    (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos,
                    (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,pcStack_20,
                    0x40001390,1,0);
  iVar1 = (this->super_FListMenuItemSelectable).super_FListMenuItem.mXpos;
  iVar2 = FFont::StringWidth(this->mFont,pcStack_20);
  uVar3 = TArray<FString,_FString>::Size(&this->mSelections);
  if (uVar3 != 0) {
    this_00 = TArray<FString,_FString>::operator[](&this->mSelections,(long)this->mSelection);
    local_30 = FString::operator_cast_to_char_(this_00);
    if (*local_30 == '$') {
      local_30 = FStringTable::operator()(&GStrings,local_30 + 1);
    }
    DCanvas::DrawText((DCanvas *)screen,this->mFont,this->mFontColor2,iVar1 + iVar2 + 8,
                      (this->super_FListMenuItemSelectable).super_FListMenuItem.mYpos,local_30,
                      0x40001390,1,0);
  }
  return;
}

Assistant:

void FValueTextItem::Drawer(bool selected)
{
	const char *text = mText;

	if (*text == '$') text = GStrings(text+1);
	screen->DrawText(mFont, selected? OptionSettings.mFontColorSelection : mFontColor, mXpos, mYpos, text, DTA_Clean, true, TAG_DONE);

	int x = mXpos + mFont->StringWidth(text) + 8;
	if (mSelections.Size() > 0)
	{
		const char *mOptValue = mSelections[mSelection];
		if (*mOptValue == '$') mOptValue = GStrings(mOptValue + 1);
		screen->DrawText(mFont, mFontColor2, x, mYpos, mOptValue, DTA_Clean, true, TAG_DONE);
	}
}